

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::FinishTransferSwept(Recycler *this,CollectionFlags flags)

{
  undefined4 *puVar1;
  ObservableValueObserver<Memory::CollectionState> *pOVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 in_RAX;
  undefined8 *in_FS_OFFSET;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((this->collectionState).value != CollectionStateTransferSweptWait) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1794,"(collectionState == CollectionStateTransferSweptWait)",
                       "collectionState == CollectionStateTransferSweptWait");
    if (!bVar4) goto LAB_002729d7;
    *puVar1 = 0;
  }
  PrintCollectTrace(this,ConcurrentSweepPhase,true,false);
  uStack_28 = CONCAT44(0x202,(undefined4)uStack_28);
  pOVar2 = (this->collectionState).observer;
  if ((pOVar2 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((this->collectionState).value != CollectionStateTransferSwept)) {
    (**pOVar2->_vptr_ObservableValueObserver)(pOVar2,(long)&uStack_28 + 4,&this->collectionState);
  }
  (this->collectionState).value = uStack_28._4_4_;
  if (Js::Configuration::Global[0x2c158] == '\x01') {
    bVar4 = HeapInfoManager::HasZeroQueuedPages(&this->autoHeap);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x179e,"(!autoHeap.HasZeroQueuedPages())","!autoHeap.HasZeroQueuedPages()"
                        );
      if (!bVar4) goto LAB_002729d7;
      *puVar1 = 0;
    }
    HeapInfoManager::FlushBackgroundPages(&this->autoHeap);
  }
  if (this->recyclerSweepManager == (RecyclerSweepManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x17a6,"(this->recyclerSweepManager != nullptr)",
                       "this->recyclerSweepManager != nullptr");
    if (!bVar4) goto LAB_002729d7;
    *puVar1 = 0;
  }
  bVar4 = RecyclerSweepManager::IsBackground(this->recyclerSweepManager);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x17a7,"(!this->recyclerSweepManager->IsBackground())",
                       "!this->recyclerSweepManager->IsBackground()");
    if (!bVar4) {
LAB_002729d7:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  if (this->inPartialCollectMode == true) {
    ConcurrentPartialTransferSweptObjects(this,this->recyclerSweepManager);
  }
  else {
    ConcurrentTransferSweptObjects(this,this->recyclerSweepManager);
  }
  RecyclerSweepManager::EndSweep(this->recyclerSweepManager);
  return;
}

Assistant:

void
Recycler::FinishTransferSwept(CollectionFlags flags)
{
    GCETW_INTERNAL(GC_START, (this, ETWEvent_ConcurrentTransferSwept));
    GCETW_INTERNAL(GC_START2, (this, ETWEvent_ConcurrentTransferSwept, this->collectionStartReason, this->collectionStartFlags));
    GCETW(GC_FLUSHZEROPAGE_START, (this));

    Assert(collectionState == CollectionStateTransferSweptWait);
#ifdef RECYCLER_TRACE
    PrintCollectTrace(Js::ConcurrentSweepPhase, true);
#endif
    SetCollectionState(CollectionStateTransferSwept);

#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        // We should have zeroed all the pages in the background thread
        Assert(!autoHeap.HasZeroQueuedPages());
        autoHeap.FlushBackgroundPages();
    }
#endif

    GCETW(GC_FLUSHZEROPAGE_STOP, (this));
    GCETW(GC_TRANSFERSWEPTOBJECTS_START, (this));

    Assert(this->recyclerSweepManager != nullptr);
    Assert(!this->recyclerSweepManager->IsBackground());
#if ENABLE_PARTIAL_GC
    if (this->inPartialCollectMode)
    {
        ConcurrentPartialTransferSweptObjects(*this->recyclerSweepManager);
    }
    else
#endif
    {
        ConcurrentTransferSweptObjects(*this->recyclerSweepManager);
    }
    recyclerSweepManager->EndSweep();

    GCETW(GC_TRANSFERSWEPTOBJECTS_STOP, (this));

    GCETW_INTERNAL(GC_STOP, (this, ETWEvent_ConcurrentTransferSwept));
    GCETW_INTERNAL(GC_STOP2, (this, ETWEvent_ConcurrentTransferSwept, this->collectionStartReason, this->collectionStartFlags));
}